

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkElement.cpp
# Opt level: O1

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::LinkElement::childElementForName(LinkElement *this,string *name)

{
  int iVar1;
  XMLParserState *pXVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<iDynTree::XMLElement> sVar5;
  undefined1 local_39;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  iVar1 = std::__cxx11::string::compare((char *)in_RDX);
  if (iVar1 == 0) {
    pXVar2 = (XMLParserState *)iDynTree::XMLElement::getParserState();
    local_38 = (InertialElement *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<iDynTree::InertialElement,std::allocator<iDynTree::InertialElement>,iDynTree::XMLParserState&,iDynTree::Link&>
              (a_Stack_30,(InertialElement **)&local_38,
               (allocator<iDynTree::InertialElement> *)&local_39,pXVar2,
               (Link *)((name->field_2)._M_local_buf + 8));
    *(undefined8 *)&this->field_0x8 = 0;
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)in_RDX);
    if (iVar1 == 0) {
      pXVar2 = (XMLParserState *)iDynTree::XMLElement::getParserState();
      pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)iDynTree::Model::getPackageDirs_abi_cxx11_();
      local_38 = (InertialElement *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<iDynTree::VisualElement,std::allocator<iDynTree::VisualElement>,iDynTree::XMLParserState&,char_const(&)[7],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                (a_Stack_30,(VisualElement **)&local_38,
                 (allocator<iDynTree::VisualElement> *)&local_39,pXVar2,(char (*) [7])"visual",
                 pvVar3);
      _Var4._M_pi = extraout_RDX_01;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)in_RDX);
      if (iVar1 != 0) {
        pXVar2 = (XMLParserState *)iDynTree::XMLElement::getParserState();
        *(undefined8 *)this = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<iDynTree::XMLElement,std::allocator<iDynTree::XMLElement>,iDynTree::XMLParserState&,std::__cxx11::string_const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_0x8,
                   (XMLElement **)this,(allocator<iDynTree::XMLElement> *)&local_38,pXVar2,in_RDX);
        _Var4._M_pi = extraout_RDX;
        goto LAB_0012fd5a;
      }
      pXVar2 = (XMLParserState *)iDynTree::XMLElement::getParserState();
      pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)iDynTree::Model::getPackageDirs_abi_cxx11_();
      local_38 = (InertialElement *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<iDynTree::VisualElement,std::allocator<iDynTree::VisualElement>,iDynTree::XMLParserState&,char_const(&)[10],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                (a_Stack_30,(VisualElement **)&local_38,
                 (allocator<iDynTree::VisualElement> *)&local_39,pXVar2,(char (*) [10])"collision",
                 pvVar3);
      _Var4._M_pi = extraout_RDX_02;
    }
    *(undefined8 *)&this->field_0x8 = 0;
  }
  *(undefined4 *)this = (undefined4)local_38;
  *(undefined4 *)&this->field_0x4 = local_38._4_4_;
  *(undefined4 *)&this->field_0x8 = a_Stack_30[0]._M_pi._0_4_;
  *(undefined4 *)&this->field_0xc = a_Stack_30[0]._M_pi._4_4_;
LAB_0012fd5a:
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_XMLElement;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<iDynTree::XMLElement> LinkElement::childElementForName(const std::string& name) {
        if (name == "inertial") {
            return std::make_shared<InertialElement>(getParserState(), m_link);
        } else if (name == "visual") {
            return std::make_shared<VisualElement>(getParserState(), "visual", m_model.getPackageDirs());
        } else if (name == "collision") {
            return std::make_shared<VisualElement>(getParserState(), "collision", m_model.getPackageDirs());
        }
        return std::make_shared<iDynTree::XMLElement>(getParserState(), name);
    }